

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O0

ostream * color::operator<<(ostream *os,shell_command command)

{
  ostream *poVar1;
  char *in_RSI;
  ostream *in_RDI;
  
  current = in_RSI;
  poVar1 = std::operator<<(in_RDI,in_RSI);
  return poVar1;
}

Assistant:

inline std::ostream & operator<<(std::ostream & os, shell_command command) {
	color::current = command;
	return os << command.command;
}